

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  bool bVar1;
  uint uVar2;
  size_t in_RAX;
  PClassActor *oldtype;
  PClass *this_00;
  PClassActor *this_01;
  uint i;
  ulong uVar3;
  size_t bucket;
  
  if (*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject
                .field_0x24 <= size) {
    bVar1 = false;
    bucket = in_RAX;
    oldtype = (PClassActor *)
              FTypeTable::FindType(&TypeTable,RegistrationInfo.MyClass,0,(long)name->Index,&bucket);
    if (oldtype != (PClassActor *)0x0) {
      if (*(int *)&(oldtype->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.super_DObject.field_0x24 == -1) {
        bVar1 = IsAncestorOf((oldtype->super_PClass).ParentClass,this);
        if (!bVar1) {
          I_Error("%s must inherit from %s but doesn\'t.",
                  FName::NameData.NameArray[name->Index].Text,
                  FName::NameData.NameArray
                  [(((oldtype->super_PClass).ParentClass)->super_PStruct).super_PNamedType.TypeName.
                   Index].Text);
        }
        DPrintf(4,"Defining placeholder class %s\n",FName::NameData.NameArray[name->Index].Text);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    this_00 = DObject::GetClass((DObject *)this);
    this_01 = (PClassActor *)CreateNew(this_00);
    (this_01->super_PClass).super_PStruct.super_PNamedType.TypeName.Index = name->Index;
    *(uint *)&(this_01->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType
              .super_DObject.field_0x24 = size;
    (this_01->super_PClass).bRuntimeClass = true;
    (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
      _vptr_DObject[0x16])(this,this_01);
    (*(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
      _vptr_DObject[0x17])(this,this_01);
    if (bVar1) {
      if (PClassActor::AllActorClasses.Count == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = PClassActor::AllActorClasses.Count - 1;
        PClassActor::AllActorClasses.Count = uVar2;
      }
      for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
        (**(code **)((long)(PClassActor::AllActorClasses.Array[uVar3]->super_PClass).super_PStruct.
                           super_PNamedType.super_PCompoundType.super_PType.super_DObject.
                           _vptr_DObject + 0xc0))
                  (PClassActor::AllActorClasses.Array[uVar3],oldtype,this_01);
        if (PClassActor::AllActorClasses.Array[uVar3] == oldtype) {
          PClassActor::AllActorClasses.Array[uVar3] = this_01;
        }
        uVar2 = PClassActor::AllActorClasses.Count;
      }
      FTypeTable::ReplaceType(&TypeTable,(PType *)this_01,(PType *)oldtype,bucket);
    }
    else {
      InsertIntoHash((PClass *)this_01);
    }
    return &this_01->super_PClass;
  }
  __assert_fail("size >= Size",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xc9f,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != NULL && (existclass->Size == TentativeClass))
	{
		type = const_cast<PClass*>(existclass);
		if (!IsDescendantOf(type->ParentClass))
		{
			I_Error("%s must inherit from %s but doesn't.", name.GetChars(), type->ParentClass->TypeName.GetChars());
		}
		DPrintf(DMSG_SPAMMY, "Defining placeholder class %s\n", name.GetChars());
		notnew = true;
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	type->TypeName = name;
	type->Size = size;
	type->bRuntimeClass = true;
	Derive(type);
	DeriveData(type);
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		PClassActor::AllActorClasses.Pop();	// remove the newly added class from the list
		// todo: replace all affected fields
		for (unsigned i = 0; i < PClassActor::AllActorClasses.Size(); i++)
		{
			PClassActor::AllActorClasses[i]->ReplaceClassRef(existclass, type);
			if (PClassActor::AllActorClasses[i] == existclass)
				PClassActor::AllActorClasses[i] = static_cast<PClassActor*>(type);
		}
		TypeTable.ReplaceType(type, existclass, bucket);
	}
	return type;
}